

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationSpeed::IntLoadConstraint_Ct
          (ChLinkMotorRotationSpeed *this,uint off_L,ChVectorDynamic<> *Qc,double c)

{
  undefined1 auVar1 [16];
  ChConstraintTwoBodies *pCVar2;
  Scalar *pSVar3;
  int i;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  dVar4 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
          super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  i = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr + -1;
  pCVar2 = ChLinkMask::Constr_N
                     (&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                       mask,i);
  if ((pCVar2->super_ChConstraintTwo).super_ChConstraint.active == true) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(i + off_L));
    auVar5._8_8_ = 0;
    auVar5._0_8_ = c;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar4 * -0.5;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *pSVar3;
    auVar1 = vfmadd213sd_fma(auVar6,auVar5,auVar1);
    *pSVar3 = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::IntLoadConstraint_Ct(const unsigned int off_L, ChVectorDynamic<>& Qc, const double c) {
    double mCt = -0.5 * m_func->Get_y(this->GetChTime());

    int ncrz = mask.nconstr - 1;
    if (mask.Constr_N(ncrz).IsActive()) {
        Qc(off_L + ncrz) += c * mCt;
    }
}